

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O1

int __thiscall QScrollBarPrivate::pixelPosToRangeValue(QScrollBarPrivate *this,int pos)

{
  QWidget *this_00;
  LayoutDirection LVar1;
  QStyle *pQVar2;
  long lVar3;
  undefined8 *puVar4;
  QStyleOptionSlider *pQVar5;
  ulong uVar6;
  int iVar7;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  QStyleOptionSlider opt;
  QStyleOptionSlider QStack_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x8;
  puVar4 = &DAT_006eba80;
  pQVar5 = &QStack_b8;
  for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined8 *)pQVar5 = *puVar4;
    puVar4 = puVar4 + 1;
    pQVar5 = (QStyleOptionSlider *)((long)pQVar5 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&QStack_b8);
  (**(code **)(*(long *)this_00 + 0x1a8))(this_00,&QStack_b8);
  pQVar2 = QWidget::style(this_00);
  auVar8 = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,2,&QStack_b8,0x80,this_00);
  uVar6 = auVar8._0_8_;
  pQVar2 = QWidget::style(this_00);
  auVar9 = (**(code **)(*(long *)pQVar2 + 0xd8))(pQVar2,2,&QStack_b8,0x40,this_00);
  if ((this->super_QAbstractSliderPrivate).orientation == Horizontal) {
    iVar7 = auVar8._8_4_ + auVar9._0_4_ + ~auVar9._8_4_;
    LVar1 = QWidget::layoutDirection(this_00);
    if (LVar1 == RightToLeft) {
      QStack_b8.upsideDown = (bool)(QStack_b8.upsideDown ^ 1);
    }
  }
  else {
    uVar6 = uVar6 >> 0x20;
    iVar7 = auVar8._12_4_ + auVar9._4_4_ + ~auVar9._12_4_;
  }
  iVar7 = QStyle::sliderValueFromPosition
                    (*(int *)&(this->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254,
                     (this->super_QAbstractSliderPrivate).maximum,pos - (int)uVar6,
                     (iVar7 - (int)uVar6) + 1,QStack_b8.upsideDown);
  QStyleOption::~QStyleOption((QStyleOption *)&QStack_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar7;
  }
  __stack_chk_fail();
}

Assistant:

int QScrollBarPrivate::pixelPosToRangeValue(int pos) const
{
    Q_Q(const QScrollBar);
    QStyleOptionSlider opt;
    q->initStyleOption(&opt);
    QRect gr = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                          QStyle::SC_ScrollBarGroove, q);
    QRect sr = q->style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                          QStyle::SC_ScrollBarSlider, q);
    int sliderMin, sliderMax, sliderLength;

    if (orientation == Qt::Horizontal) {
        sliderLength = sr.width();
        sliderMin = gr.x();
        sliderMax = gr.right() - sliderLength + 1;
        if (q->layoutDirection() == Qt::RightToLeft)
            opt.upsideDown = !opt.upsideDown;
    } else {
        sliderLength = sr.height();
        sliderMin = gr.y();
        sliderMax = gr.bottom() - sliderLength + 1;
    }

    return  QStyle::sliderValueFromPosition(minimum, maximum, pos - sliderMin,
                                            sliderMax - sliderMin, opt.upsideDown);
}